

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

int __thiscall CConnman::GetExtraBlockRelayCount(CConnman *this)

{
  CNode *pCVar1;
  int iVar2;
  pointer ppCVar3;
  int iVar4;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock74;
  unique_lock<std::recursive_mutex> uStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = 0;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&uStack_28,&this->m_nodes_mutex,
             "m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0x967,false);
  for (ppCVar3 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppCVar3 !=
      (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppCVar3 = ppCVar3 + 1) {
    pCVar1 = *ppCVar3;
    if ((((pCVar1->fSuccessfullyConnected)._M_base._M_i & 1U) != 0) &&
       (((pCVar1->fDisconnect)._M_base._M_i & 1U) == 0)) {
      iVar4 = iVar4 + (uint)(pCVar1->m_conn_type == BLOCK_RELAY);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&uStack_28);
  iVar4 = iVar4 - this->m_max_outbound_block_relay;
  iVar2 = 0;
  if (0 < iVar4) {
    iVar2 = iVar4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

int CConnman::GetExtraBlockRelayCount() const
{
    int block_relay_peers = 0;
    {
        LOCK(m_nodes_mutex);
        for (const CNode* pnode : m_nodes) {
            if (pnode->fSuccessfullyConnected && !pnode->fDisconnect && pnode->IsBlockOnlyConn()) {
                ++block_relay_peers;
            }
        }
    }
    return std::max(block_relay_peers - m_max_outbound_block_relay, 0);
}